

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::String::String(String *this,tagbstring *x)

{
  int iVar1;
  uchar *puVar2;
  
  iVar1 = x->slen;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  (this->super_tagbstring).data = (uchar *)0x0;
  if ((-1 < (long)iVar1) && (x->data != (uchar *)0x0)) {
    puVar2 = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = puVar2;
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 == (uchar *)0x0) {
    Bstrlib::String();
  }
  else {
    memcpy(puVar2,x->data,(long)iVar1);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(const tagbstring& x)
    {
        slen = x.slen;
        mlen = slen + 1;
        data = 0;
        if (slen >= 0 && x.data != NULL)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (tagbstring) constructor");
        }
        else
        {
            memcpy(data, x.data, slen);
            data[slen] = '\0';
        }
    }